

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

bool recall_tree_ns::is_candidate(recall_tree *b,uint32_t cn,example *ec)

{
  node *pnVar1;
  node_pred *pnVar2;
  node_pred *pnVar3;
  node_pred *pnVar4;
  
  pnVar1 = (b->nodes)._begin;
  pnVar3 = pnVar1[cn].preds._begin;
  pnVar2 = pnVar1[cn].preds._end;
  if (pnVar3 != pnVar2) {
    pnVar4 = pnVar3 + b->max_candidates;
    do {
      if (pnVar4 <= pnVar3) {
        return false;
      }
      if (pnVar3->label == (ec->l).multi.label) {
        return true;
      }
      pnVar3 = pnVar3 + 1;
    } while (pnVar3 != pnVar2);
  }
  return false;
}

Assistant:

bool is_candidate(recall_tree& b, uint32_t cn, example& ec)
{
  for (node_pred* ls = b.nodes[cn].preds.begin();
       ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
  {
    if (ls->label == ec.l.multi.label)
      return true;
  }

  return false;
}